

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceGroup * __thiscall
cmMakefile::FindSourceGroup
          (cmMakefile *this,char *source,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *groups)

{
  bool bVar1;
  pointer pcVar2;
  cmSourceGroup *pcVar3;
  reference pvVar4;
  cmSourceGroup *result_1;
  undefined1 local_48 [8];
  reverse_iterator sg_1;
  cmSourceGroup *result;
  reverse_iterator sg;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *groups_local;
  char *source_local;
  cmMakefile *this_local;
  
  sg.current._M_current =
       (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
        )(__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
          )groups;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::rbegin
            ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&stack0xffffffffffffffd0);
  while( true ) {
    std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::rend
              ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&result);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                             *)&stack0xffffffffffffffd0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                             *)&result);
    if (!bVar1) {
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::rbegin
                ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_48);
      while( true ) {
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::rend
                  ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&result_1);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                                 *)local_48,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                                 *)&result_1);
        if (!bVar1) {
          pvVar4 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::front
                             ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                              sg.current._M_current);
          return pvVar4;
        }
        pcVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                               *)local_48);
        pcVar3 = cmSourceGroup::MatchChildrenRegex(pcVar2,source);
        if (pcVar3 != (cmSourceGroup *)0x0) break;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                      *)local_48);
      }
      return pcVar3;
    }
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                           *)&stack0xffffffffffffffd0);
    sg_1.current._M_current =
         (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
          )cmSourceGroup::MatchChildrenFiles(pcVar2,source);
    if (sg_1.current._M_current != (cmSourceGroup *)0x0) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  return (cmSourceGroup *)sg_1.current._M_current;
}

Assistant:

cmSourceGroup* cmMakefile::FindSourceGroup(
  const char* source, std::vector<cmSourceGroup>& groups) const
{
  // First search for a group that lists the file explicitly.
  for (std::vector<cmSourceGroup>::reverse_iterator sg = groups.rbegin();
       sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenFiles(source);
    if (result) {
      return result;
    }
  }

  // Now search for a group whose regex matches the file.
  for (std::vector<cmSourceGroup>::reverse_iterator sg = groups.rbegin();
       sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenRegex(source);
    if (result) {
      return result;
    }
  }

  // Shouldn't get here, but just in case, return the default group.
  return &groups.front();
}